

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O0

DoubleFormatter __thiscall mp::BasicSolver::FormatObjValue(BasicSolver *this,double value)

{
  char *__nptr;
  long in_RDI;
  undefined8 in_XMM0_Qa;
  DoubleFormatter DVar1;
  char *s;
  DoubleFormatter formatter;
  int local_34;
  
  if (*(int *)(in_RDI + 0x184) < 0) {
    __nptr = getenv("objective_precision");
    if (__nptr == (char *)0x0) {
      local_34 = 0;
    }
    else {
      local_34 = atoi(__nptr);
    }
    *(int *)(in_RDI + 0x184) = local_34;
    if (*(int *)(in_RDI + 0x184) == 0) {
      *(undefined4 *)(in_RDI + 0x184) = 0xf;
    }
  }
  DVar1.precision = *(undefined4 *)(in_RDI + 0x184);
  DVar1.value = (double)in_XMM0_Qa;
  DVar1._12_4_ = 0;
  return DVar1;
}

Assistant:

BasicSolver::DoubleFormatter BasicSolver::FormatObjValue(double value) {
  if (obj_precision_ < 0) {
    const char *s =  std::getenv("objective_precision");
    obj_precision_ = s ? std::atoi(s) : 0;
    if (obj_precision_ == 0)
      obj_precision_ = DEFAULT_PRECISION;
  }
  DoubleFormatter formatter = {value, obj_precision_};
  return formatter;
}